

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

void CVmObjGramProd::enum_props_cb(void *ctx0,vm_prop_id_t prop,vm_val_t *param_3)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = *ctx0;
  lVar3 = *(long *)((long)ctx0 + 8);
  lVar4 = *(long *)(lVar1 + 0x20);
  lVar5 = 0;
  while( true ) {
    if (lVar3 == lVar5) {
      if (lVar3 == *(long *)(lVar1 + 0x28)) {
        *(long *)(lVar1 + 0x28) = lVar3 + 0x40;
        pvVar2 = realloc(*(void **)(*ctx0 + 0x20),*(long *)(*ctx0 + 0x28) * 2);
        *(void **)(*ctx0 + 0x20) = pvVar2;
        lVar3 = *(long *)((long)ctx0 + 8);
        lVar4 = *(long *)(*ctx0 + 0x20);
      }
      *(vm_prop_id_t *)(lVar4 + lVar3 * 2) = prop;
      *(long *)((long)ctx0 + 8) = *(long *)((long)ctx0 + 8) + 1;
      return;
    }
    if (*(vm_prop_id_t *)(lVar4 + lVar5 * 2) == prop) break;
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

void CVmObjGramProd::enum_props_cb(VMG_ void *ctx0, vm_prop_id_t prop,
                                   const vm_val_t * /*match_val*/)
{
    enum_props_ctx *ctx = (enum_props_ctx *)ctx0;
    vmgram_match_info *ep;
    size_t i;

    /* if this property is already in our list, don't add it again */
    for (i = 0, ep = ctx->ext->prop_enum_arr_ ; i < ctx->cnt ; ++i, ++ep)
    {
        /* if we already have this one, we can ignore it */
        if (ep->prop == prop)
            return;
    }
    
    /* we need to add it - if the array is full, expand it */
    if (ctx->cnt == ctx->ext->prop_enum_max_)
    {
        /* reallocate the array with more space */
        ctx->ext->prop_enum_max_ += 64;
        ctx->ext->prop_enum_arr_ = (vmgram_match_info *)
                                   t3realloc(ctx->ext->prop_enum_arr_,
                                             ctx->ext->prop_enum_max_
                                             * sizeof(vmgram_match_info));
    }

    /* add the property to the array */
    ep = &ctx->ext->prop_enum_arr_[ctx->cnt];
    ep->prop = prop;

    /* count the new entry */
    ctx->cnt++;
}